

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::isListening(FileServer *this)

{
  bool bVar1;
  pointer pIVar2;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x134be8);
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  pIVar2 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134c06);
  bVar1 = pIVar2->isListening;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x134c17);
  return (bool)(bVar1 & 1);
}

Assistant:

bool FileServer::isListening() {
    std::lock_guard<std::mutex> lock(m_impl->mutex);
    return m_impl->isListening;
}